

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

double __thiscall imrt::ApertureILS::perturbation(ApertureILS *this,Plan *P)

{
  list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_> *plVar1;
  _List_node_base *p_Var2;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *plVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  ostream *poVar8;
  uint uVar9;
  ulong uVar10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_98;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_80;
  ApertureILS *local_68;
  double local_60;
  Plan *local_58;
  ulong local_50;
  _List_node_base local_48;
  ulong local_38;
  
  local_68 = this;
  __x = Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)&local_48,__x);
  local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node._M_size = 0;
  local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
  local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
  local_58 = P;
  local_60 = Plan::getEvaluation(P);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##  Perturbation: ",0x12);
  if (local_68->perturbation_size == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"none",4);
  }
  else {
    plVar1 = &local_68->tabu;
    p_Var12 = (local_68->tabu).
              super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var12 != (_List_node_base *)plVar1) {
      p_Var11 = p_Var12->_M_next;
      operator_delete(p_Var12);
      p_Var12 = p_Var11;
    }
    (local_68->tabu).
    super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
    (local_68->tabu).
    super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
    (local_68->tabu).
    super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
    ._M_impl._M_node._M_size = 0;
  }
  if (0 < local_68->perturbation_size) {
    uVar10 = 0;
    do {
      p_Var12 = local_48._M_next;
      local_50 = uVar10;
      iVar5 = rand();
      uVar10 = (ulong)(long)iVar5 % local_38;
      if ((long)uVar10 < 1) {
        for (; uVar10 != 0; uVar10 = uVar10 + 1) {
          p_Var12 = p_Var12->_M_prev;
        }
      }
      else {
        do {
          p_Var12 = p_Var12->_M_next;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      iVar5 = rand();
      if ((double)iVar5 / 2147483647.0 <= 0.3) {
        do {
          iVar5 = rand();
          iVar6 = Collimator::getNangleBeamlets
                            ((Collimator *)p_Var12[1]._M_next[0xb]._M_next,
                             *(int *)&(p_Var12[1]._M_next)->_M_prev);
          iVar5 = iVar5 % iVar6;
          bVar4 = Station::isActiveBeamlet((Station *)p_Var12[1]._M_next,iVar5);
        } while (!bVar4);
        iVar6 = rand();
        iVar6 = iVar6 % ((Station *)p_Var12[1]._M_next)->max_apertures;
        bVar4 = Station::isOpenBeamlet((Station *)p_Var12[1]._M_next,iVar5,iVar6);
        if (bVar4) {
          iVar7 = rand();
          if ((double)iVar7 / 2147483647.0 <= 0.5) {
            Station::closeBeamlet_abi_cxx11_
                      (&local_80,(Station *)p_Var12[1]._M_next,iVar5,iVar6,true);
            p_Var11 = local_98.
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
            if (local_98.
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
              do {
                p_Var2 = p_Var11->_M_next;
                operator_delete(p_Var11);
                p_Var11 = p_Var2;
              } while (p_Var2 != (_List_node_base *)&local_98);
            }
          }
          else {
            Station::closeBeamlet_abi_cxx11_
                      (&local_80,(Station *)p_Var12[1]._M_next,iVar5,iVar6,false);
            p_Var11 = local_98.
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
            if (local_98.
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
              do {
                p_Var2 = p_Var11->_M_next;
                operator_delete(p_Var11);
                p_Var11 = p_Var2;
              } while (p_Var2 != (_List_node_base *)&local_98);
            }
          }
        }
        else {
          Station::openBeamlet_abi_cxx11_(&local_80,(Station *)p_Var12[1]._M_next,iVar5,iVar6);
          p_Var11 = local_98.
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          if (local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
            do {
              p_Var2 = p_Var11->_M_next;
              operator_delete(p_Var11);
              p_Var11 = p_Var2;
            } while (p_Var2 != (_List_node_base *)&local_98);
          }
        }
        local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size = 0;
        if (local_80.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_80) {
          plVar3 = &local_98;
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
        }
        else {
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next =
               local_80.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_prev =
               local_80.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_prev;
          (local_80.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_prev)->_M_next = (_List_node_base *)&local_98;
          (local_80.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)&local_98;
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node._M_size =
               local_80.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node._M_size;
          plVar3 = &local_80;
        }
        (plVar3->super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
        ._M_impl._M_node._M_size = 0;
        local_60 = Plan::incremental_eval(local_58,(Station *)p_Var12[1]._M_next,&local_98);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
        poVar8 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,*(int *)&(p_Var12[1]._M_next)->_M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
      }
      else {
        iVar5 = rand();
        iVar5 = iVar5 % *(int *)&p_Var12[1]._M_next[4]._M_next;
        iVar6 = rand();
        if ((double)iVar6 / 2147483647.0 <= 0.5) {
          Station::modifyIntensityAperture_abi_cxx11_
                    (&local_80,(Station *)p_Var12[1]._M_next,iVar5,(double)local_68->step_intensity)
          ;
          p_Var11 = local_98.
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          if (local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
            do {
              p_Var2 = p_Var11->_M_next;
              operator_delete(p_Var11);
              p_Var11 = p_Var2;
            } while (p_Var2 != (_List_node_base *)&local_98);
          }
        }
        else {
          Station::modifyIntensityAperture_abi_cxx11_
                    (&local_80,(Station *)p_Var12[1]._M_next,iVar5,(double)-local_68->step_intensity
                    );
          p_Var11 = local_98.
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          if (local_98.
              super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
            do {
              p_Var2 = p_Var11->_M_next;
              operator_delete(p_Var11);
              p_Var11 = p_Var2;
            } while (p_Var2 != (_List_node_base *)&local_98);
          }
        }
        local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size = 0;
        if (local_80.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_80) {
          plVar3 = &local_98;
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
        }
        else {
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_next =
               local_80.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node.super__List_node_base._M_prev =
               local_80.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_prev;
          (local_80.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_prev)->_M_next = (_List_node_base *)&local_98;
          (local_80.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)&local_98;
          local_98.
          super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
          ._M_node._M_size =
               local_80.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node._M_size;
          plVar3 = &local_80;
        }
        (plVar3->super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
        ._M_impl._M_node._M_size = 0;
        local_60 = Plan::incremental_eval(local_58,(Station *)p_Var12[1]._M_next,&local_98);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
        poVar8 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,*(int *)&(p_Var12[1]._M_next)->_M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
      }
      Station::clearHistory((Station *)p_Var12[1]._M_next);
      uVar9 = (int)local_50 + 1;
      uVar10 = (ulong)uVar9;
    } while ((int)uVar9 < local_68->perturbation_size);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", new eval: ",0xc);
  poVar8 = std::ostream::_M_insert<double>(local_60);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  p_Var12 = local_98.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (local_98.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
    do {
      p_Var11 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 &p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var12);
      p_Var12 = p_Var11;
    } while (p_Var11 != (_List_node_base *)&local_98);
  }
  while (local_48._M_next != &local_48) {
    p_Var12 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
               &(local_48._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_48._M_next);
    local_48._M_next = p_Var12;
  }
  return local_60;
}

Assistant:

double ApertureILS::perturbation(Plan& P) {
  list<Station*> stations = P.get_stations();
  int beamlet, aperture;
  list<pair<int,double>> diff;
  double aux_eval=P.getEvaluation();
  
  cout << "##  Perturbation: " ;
  if (perturbation_size==0) cout << "none";   
  else tabu.clear();
  for (int i=0; i<perturbation_size; i++) {
    list<Station*>::iterator s=stations.begin();
    std::advance(s,rand()%stations.size());
    if (((double) rand() / (RAND_MAX)) > 0.3) {
      //Modify intensity
      aperture = (rand()% (*s)->getNbApertures());
      if (((double) rand() / (RAND_MAX)) > 0.5){ 
        diff = (*s)->modifyIntensityAperture(aperture, -step_intensity);
      }else{ 
        diff = (*s)->modifyIntensityAperture(aperture, step_intensity);
      }
      aux_eval = P.incremental_eval(*(*s), diff);
      cout << "(" << (*s)->getAngle() << ","<< aperture<<") ";
    } else {
      //Modify aperture
      do { 
        beamlet = (rand()% (*s)->getNbBeamlets());
      } while (!(*s)->isActiveBeamlet(beamlet));
      aperture = (rand()% (*s)->getNbApertures());
      if ((*s)->isOpenBeamlet(beamlet, aperture)){
        if (((double) rand() / (RAND_MAX)) > 0.5) 
          diff = (*s)->closeBeamlet(beamlet, aperture, false);
        else
          diff = (*s)->closeBeamlet(beamlet, aperture, true);
      } else {
        diff = (*s)->openBeamlet(beamlet, aperture);
      }
      aux_eval = P.incremental_eval(*(*s), diff);
      cout << "(" << (*s)->getAngle() << "," << aperture<< "," << beamlet << ") ";
    }
    (*s)->clearHistory();
  }
  
  //aux_eval = P.eval();
  cout << ", new eval: "<< aux_eval<< endl;
  return(aux_eval);
}